

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  FileDescriptorProto *pFVar1;
  bool bVar2;
  int iVar3;
  DescriptorProto *message_00;
  EnumDescriptorProto *enum_type;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions;
  MessageOptions *options;
  OneofDescriptorProto *oneof_decl;
  FieldDescriptorProto *field;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar4;
  undefined1 local_170 [8];
  LocationRecorder location_5;
  LocationRecorder oneof_location;
  undefined1 auStack_138 [4];
  int oneof_index;
  undefined1 local_128 [8];
  LocationRecorder location_4;
  undefined1 local_100 [8];
  LocationRecorder location_3;
  string_view local_d8;
  undefined1 local_c8 [8];
  LocationRecorder location_2;
  undefined1 local_a0 [8];
  LocationRecorder location_1;
  undefined1 local_68 [8];
  LocationRecorder location;
  string_view local_40;
  FileDescriptorProto *local_30;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  local_30 = containing_file;
  containing_file_local = (FileDescriptorProto *)message_location;
  message_location_local = (LocationRecorder *)message;
  message_local = (DescriptorProto *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,";");
  bVar2 = TryConsumeEndOfDeclaration(this,local_40,(LocationRecorder *)0x0);
  if (bVar2) {
    this_local._7_1_ = 1;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"message");
    bVar2 = LookingAt(this,stack0xffffffffffffffb0);
    pFVar1 = containing_file_local;
    if (bVar2) {
      iVar3 = DescriptorProto::nested_type_size((DescriptorProto *)message_location_local);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_68,(LocationRecorder *)pFVar1,3,iVar3);
      message_00 = DescriptorProto::add_nested_type((DescriptorProto *)message_location_local);
      this_local._7_1_ =
           ParseMessageDefinition(this,message_00,(LocationRecorder *)local_68,local_30);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_68);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&location_1.location_,"enum");
      bVar2 = LookingAt(this,stack0xffffffffffffff78);
      pFVar1 = containing_file_local;
      if (bVar2) {
        iVar3 = DescriptorProto::enum_type_size((DescriptorProto *)message_location_local);
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)local_a0,(LocationRecorder *)pFVar1,4,iVar3);
        enum_type = DescriptorProto::add_enum_type((DescriptorProto *)message_location_local);
        this_local._7_1_ = ParseEnumDefinition(this,enum_type,(LocationRecorder *)local_a0,local_30)
        ;
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_a0);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&location_2.location_,
                   "extensions");
        bVar2 = LookingAt(this,stack0xffffffffffffff50);
        if (bVar2) {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_c8,(LocationRecorder *)containing_file_local,5);
          this_local._7_1_ =
               ParseExtensions(this,(DescriptorProto *)message_location_local,
                               (LocationRecorder *)local_c8,local_30);
          LocationRecorder::~LocationRecorder((LocationRecorder *)local_c8);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_d8,"reserved");
          bVar2 = LookingAt(this,local_d8);
          if (bVar2) {
            this_local._7_1_ =
                 ParseReserved(this,(DescriptorProto *)message_location_local,
                               (LocationRecorder *)containing_file_local);
          }
          else {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)&location_3.location_,
                       "extend");
            bVar2 = LookingAt(this,stack0xffffffffffffff18);
            if (bVar2) {
              LocationRecorder::LocationRecorder
                        ((LocationRecorder *)local_100,(LocationRecorder *)containing_file_local,6);
              extensions = DescriptorProto::mutable_extension
                                     ((DescriptorProto *)message_location_local);
              pRVar4 = DescriptorProto::mutable_nested_type
                                 ((DescriptorProto *)message_location_local);
              this_local._7_1_ =
                   ParseExtend(this,extensions,pRVar4,(LocationRecorder *)containing_file_local,3,
                               (LocationRecorder *)local_100,local_30);
              LocationRecorder::~LocationRecorder((LocationRecorder *)local_100);
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&location_4.location_,
                         "option");
              bVar2 = LookingAt(this,stack0xfffffffffffffef0);
              if (bVar2) {
                LocationRecorder::LocationRecorder
                          ((LocationRecorder *)local_128,(LocationRecorder *)containing_file_local,7
                          );
                options = DescriptorProto::mutable_options
                                    ((DescriptorProto *)message_location_local);
                this_local._7_1_ =
                     ParseOption(this,&options->super_Message,(LocationRecorder *)local_128,local_30
                                 ,OPTION_STATEMENT);
                LocationRecorder::~LocationRecorder((LocationRecorder *)local_128);
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_138,"oneof");
                bVar2 = LookingAt(this,_auStack_138);
                pFVar1 = containing_file_local;
                if (bVar2) {
                  iVar3 = DescriptorProto::oneof_decl_size
                                    ((DescriptorProto *)message_location_local);
                  LocationRecorder::LocationRecorder
                            ((LocationRecorder *)&location_5.location_,
                             (LocationRecorder *)containing_file_local,8,iVar3);
                  oneof_decl = DescriptorProto::add_oneof_decl
                                         ((DescriptorProto *)message_location_local);
                  this_local._7_1_ =
                       ParseOneof(this,oneof_decl,(DescriptorProto *)message_location_local,iVar3,
                                  (LocationRecorder *)&location_5.location_,
                                  (LocationRecorder *)containing_file_local,local_30);
                  LocationRecorder::~LocationRecorder((LocationRecorder *)&location_5.location_);
                }
                else {
                  iVar3 = DescriptorProto::field_size((DescriptorProto *)message_location_local);
                  LocationRecorder::LocationRecorder
                            ((LocationRecorder *)local_170,(LocationRecorder *)pFVar1,2,iVar3);
                  field = DescriptorProto::add_field((DescriptorProto *)message_location_local);
                  pRVar4 = DescriptorProto::mutable_nested_type
                                     ((DescriptorProto *)message_location_local);
                  this_local._7_1_ =
                       ParseMessageField(this,field,pRVar4,(LocationRecorder *)containing_file_local
                                         ,3,(LocationRecorder *)local_170,local_30);
                  LocationRecorder::~LocationRecorder((LocationRecorder *)local_170);
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location,
                                  containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(), message_location,
                       DescriptorProto::kNestedTypeFieldNumber, location,
                       containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(
        message_location, DescriptorProto::kOneofDeclFieldNumber, oneof_index);

    return ParseOneof(message->add_oneof_decl(), message, oneof_index,
                      oneof_location, message_location, containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(
        message->add_field(), message->mutable_nested_type(), message_location,
        DescriptorProto::kNestedTypeFieldNumber, location, containing_file);
  }
}